

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

string * __thiscall
spvtools::opt::analysis::Struct::str_abi_cxx11_(string *__return_storage_ptr__,Struct *this)

{
  long lVar1;
  long lVar2;
  ostringstream oss;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{",1);
  lVar2 = (long)(this->element_types_).
                super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->element_types_).
                super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar2 != 0) {
    lVar2 = lVar2 >> 3;
    lVar1 = 0;
    do {
      (*(this->element_types_).
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar1]->_vptr_Type[3])(&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      if (lVar2 + -1 != lVar1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      lVar1 = lVar1 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Struct::str() const {
  std::ostringstream oss;
  oss << "{";
  const size_t count = element_types_.size();
  for (size_t i = 0; i < count; ++i) {
    oss << element_types_[i]->str();
    if (i + 1 != count) oss << ", ";
  }
  oss << "}";
  return oss.str();
}